

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStrUtil.cpp
# Opt level: O2

ostream * glu::operator<<(ostream *str,ApiType apiType)

{
  ostream *poVar1;
  char *pcVar2;
  uint uVar3;
  
  std::operator<<(str,"OpenGL ");
  uVar3 = apiType.m_bits >> 8 & 3;
  if (uVar3 == 0) {
    std::operator<<(str,"ES ");
  }
  poVar1 = (ostream *)std::ostream::operator<<(str,apiType.m_bits & 0xf);
  poVar1 = std::operator<<(poVar1,".");
  std::ostream::operator<<(poVar1,apiType.m_bits >> 4 & 0xf);
  if (uVar3 == 1) {
    pcVar2 = " core profile";
  }
  else if (uVar3 == 2) {
    pcVar2 = " compatibility profile";
  }
  else {
    if (uVar3 == 0) {
      return str;
    }
    pcVar2 = " (unknown profile)";
  }
  std::operator<<(str,pcVar2);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, ApiType apiType)
{
	str << "OpenGL ";

	if (apiType.getProfile() == PROFILE_ES)
		str << "ES ";

	str << apiType.getMajorVersion() << "." << apiType.getMinorVersion();

	if (apiType.getProfile() == PROFILE_CORE)
		str << " core profile";
	else if (apiType.getProfile() == PROFILE_COMPATIBILITY)
		str << " compatibility profile";
	else if (apiType.getProfile() != PROFILE_ES)
		str << " (unknown profile)";

	return str;
}